

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.c
# Opt level: O3

apx_vm_writeState_t * apx_vm_writeState_new(void)

{
  apx_vm_writeState_t *paVar1;
  
  paVar1 = (apx_vm_writeState_t *)malloc(0x50);
  if (paVar1 != (apx_vm_writeState_t *)0x0) {
    paVar1->parent = (apx_vm_writeState_tag *)0x0;
    adt_str_create(&paVar1->field_name);
    paVar1->index = 0;
    paVar1->array_len = 0;
    paVar1->max_array_len = 0;
    paVar1->element_size = 0;
    paVar1->value_type = DTL_DV_NULL;
    paVar1->scalar_storage_type = '\0';
    paVar1->type_code = '\0';
    paVar1->is_last_field = false;
    paVar1->dynamic_size_type = '\0';
    (paVar1->scalar_value).i32 = 0;
    paVar1->range_check_state = '\0';
  }
  return paVar1;
}

Assistant:

apx_vm_writeState_t* apx_vm_writeState_new(void)
{
   apx_vm_writeState_t* self = (apx_vm_writeState_t*)malloc(sizeof(apx_vm_writeState_t));
   if (self != NULL)
   {
      apx_vm_writeState_create(self);
   }
   return self;
}